

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,double *t)

{
  double dVar1;
  double local_60;
  double t2;
  double t2hc;
  double tca;
  double l20c;
  Vector l;
  double *t_local;
  Ray *ray_local;
  Sphere *this_local;
  
  SphereTestCount = SphereTestCount + 1;
  l.z = (double)t;
  operator-((Vector *)&l20c,&this->loc,&ray->org);
  dVar1 = operator&((Vector *)&l20c,(Vector *)&l20c);
  local_60 = operator&((Vector *)&l20c,&ray->dir);
  dVar1 = local_60 * local_60 + (this->radius2 - dVar1);
  if (0.0 < dVar1) {
    dVar1 = sqrt(dVar1);
    if (dVar1 <= local_60) {
      *(double *)l.z = local_60 - dVar1;
      local_60 = local_60 + dVar1;
    }
    else {
      *(double *)l.z = local_60 + dVar1;
      local_60 = local_60 - dVar1;
    }
    if (ABS(*(double *)l.z) < geom_threshold) {
      *(double *)l.z = local_60;
    }
    if (*(double *)l.z <= geom_threshold) {
      SphereTestMisses = SphereTestMisses + 1;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    SphereTestMisses = SphereTestMisses + 1;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Sphere::intersect(Ray& ray, double& t)
{
   STAT( SphereTestCount++  );

   Vector l = loc - ray.org;
   double l20c = l   & l;
   double tca = l & ray.dir;
   double t2hc = radius2 - l20c + tca * tca;
   double t2;

   if(   t2hc <=  0.0   )
   {
      STAT( SphereTestMisses++ );
      return false;
   }

   t2hc = sqrt(t2hc);

   if(   tca   < t2hc)  // we are inside
   {
      t  = tca + t2hc;
      t2 = tca - t2hc;
   }
   else        // we are outside
   {
      t  = tca - t2hc;
      t2 = tca + t2hc;
   }

   if(   fabs(t)  < geom_threshold ) t = t2;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(SphereTestMisses++);
      return false;
   }
}